

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool kwssys::SystemTools::FileIsExecutable(string *inName)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  
  bVar1 = FileIsDirectory(inName);
  bVar3 = false;
  if ((!bVar1) && (bVar3 = false, inName->_M_string_length != 0)) {
    iVar2 = access((inName->_M_dataplus)._M_p,1);
    bVar3 = iVar2 == 0;
  }
  return bVar3;
}

Assistant:

bool SystemTools::FileIsExecutable(const std::string& inName)
{
#ifdef _WIN32
  char local_buffer[KWSYS_SYSTEMTOOLS_MAXPATH];
  std::string string_buffer;
  const auto name = RemoveTrailingSlashes(inName, local_buffer, string_buffer);
  const auto attr =
    GetFileAttributesW(Encoding::ToWindowsExtendedPath(name).c_str());

  // On Windows any file that exists and is not a directory is considered
  // readable and therefore also executable:
  return attr != INVALID_FILE_ATTRIBUTES && !(attr & FILE_ATTRIBUTE_DIRECTORY);
#else
  return !FileIsDirectory(inName) && TestFileAccess(inName, TEST_FILE_EXECUTE);
#endif
}